

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_sqr_512(uint64_t *l,secp256k1_scalar *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  secp256k1_scalar *a_local;
  uint64_t *l_local;
  
  uVar1 = a->d[0];
  uVar30 = a->d[1];
  uVar2 = a->d[2];
  uVar3 = a->d[3];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  uVar32 = SUB168(auVar4 * auVar14,8);
  *l = SUB168(auVar4 * auVar14,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar30;
  auVar5 = auVar5 * auVar15;
  uVar33 = auVar5._8_8_;
  auVar26._8_8_ = uVar33;
  auVar26._0_8_ = uVar32;
  uVar28 = auVar5._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar28;
  auVar5 = auVar5 + auVar26;
  uVar32 = (ulong)CARRY8(uVar32,uVar28);
  uVar38 = SUB168(auVar5 + auVar27,8);
  uVar40 = (ulong)CARRY8(uVar33,uVar32) +
           (ulong)(CARRY8(uVar33 + uVar32,uVar33) ||
                  CARRY8(auVar5._8_8_,(ulong)CARRY8(auVar5._0_8_,uVar28)));
  l[1] = SUB168(auVar5 + auVar27,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar2;
  uVar34 = SUB168(auVar6 * auVar16,8);
  uVar28 = SUB168(auVar6 * auVar16,0);
  uVar33 = uVar38 + uVar28;
  uVar32 = (ulong)CARRY8(uVar38,uVar28);
  uVar38 = uVar40 + uVar34;
  uVar41 = uVar38 + uVar32;
  uVar39 = uVar33 + uVar28;
  uVar28 = (ulong)CARRY8(uVar33,uVar28);
  uVar31 = uVar41 + uVar34;
  uVar42 = uVar31 + uVar28;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar30;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar30;
  uVar35 = SUB168(auVar7 * auVar17,8);
  uVar29 = SUB168(auVar7 * auVar17,0);
  uVar33 = (ulong)CARRY8(uVar39,uVar29);
  uVar36 = uVar42 + uVar35;
  uVar43 = uVar36 + uVar33;
  uVar40 = (ulong)(CARRY8(uVar40,uVar34) || CARRY8(uVar38,uVar32)) +
           (ulong)(CARRY8(uVar41,uVar34) || CARRY8(uVar31,uVar28)) +
           (ulong)(CARRY8(uVar42,uVar35) || CARRY8(uVar36,uVar33));
  l[2] = uVar39 + uVar29;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar3;
  uVar35 = SUB168(auVar8 * auVar18,8);
  uVar32 = SUB168(auVar8 * auVar18,0);
  uVar28 = uVar43 + uVar32;
  uVar1 = (ulong)CARRY8(uVar43,uVar32);
  uVar38 = uVar40 + uVar35;
  uVar41 = uVar38 + uVar1;
  uVar33 = uVar28 + uVar32;
  uVar32 = (ulong)CARRY8(uVar28,uVar32);
  uVar31 = uVar41 + uVar35;
  uVar42 = uVar31 + uVar32;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar30;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  uVar39 = SUB168(auVar9 * auVar19,8);
  uVar34 = SUB168(auVar9 * auVar19,0);
  uVar44 = uVar33 + uVar34;
  uVar28 = (ulong)CARRY8(uVar33,uVar34);
  uVar36 = uVar42 + uVar39;
  uVar43 = uVar36 + uVar28;
  uVar33 = (ulong)CARRY8(uVar44,uVar34);
  uVar29 = uVar43 + uVar39;
  uVar37 = uVar29 + uVar33;
  uVar35 = (ulong)(CARRY8(uVar40,uVar35) || CARRY8(uVar38,uVar1)) +
           (ulong)(CARRY8(uVar41,uVar35) || CARRY8(uVar31,uVar32)) +
           (ulong)(CARRY8(uVar42,uVar39) || CARRY8(uVar36,uVar28)) +
           (ulong)(CARRY8(uVar43,uVar39) || CARRY8(uVar29,uVar33));
  l[3] = uVar44 + uVar34;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar30;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  uVar36 = SUB168(auVar10 * auVar20,8);
  uVar30 = SUB168(auVar10 * auVar20,0);
  uVar32 = uVar37 + uVar30;
  uVar1 = (ulong)CARRY8(uVar37,uVar30);
  uVar28 = uVar35 + uVar36;
  uVar39 = uVar28 + uVar1;
  uVar34 = uVar32 + uVar30;
  uVar30 = (ulong)CARRY8(uVar32,uVar30);
  uVar33 = uVar39 + uVar36;
  uVar40 = uVar33 + uVar30;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  uVar29 = SUB168(auVar11 * auVar21,8);
  uVar31 = SUB168(auVar11 * auVar21,0);
  uVar32 = (ulong)CARRY8(uVar34,uVar31);
  uVar38 = uVar40 + uVar29;
  uVar41 = uVar38 + uVar32;
  uVar36 = (ulong)(CARRY8(uVar35,uVar36) || CARRY8(uVar28,uVar1)) +
           (ulong)(CARRY8(uVar39,uVar36) || CARRY8(uVar33,uVar30)) +
           (ulong)(CARRY8(uVar40,uVar29) || CARRY8(uVar38,uVar32));
  l[4] = uVar34 + uVar31;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar3;
  auVar12 = auVar12 * auVar22;
  uVar33 = auVar12._8_8_;
  uVar28 = auVar12._0_8_;
  uVar38 = SUB168(auVar12 + auVar24,0);
  uVar1 = (ulong)CARRY8(uVar41,uVar28);
  uVar2 = uVar36 + uVar33;
  auVar24._8_8_ = uVar2;
  auVar24._0_8_ = uVar41;
  uVar30 = (ulong)CARRY8(uVar38,uVar28);
  uVar32 = SUB168(auVar12 + auVar24,8);
  auVar25._8_8_ =
       (ulong)(CARRY8(uVar36,uVar33) || CARRY8(uVar2,uVar1)) +
       (ulong)(CARRY8(uVar2 + uVar1,uVar33) || CARRY8(uVar32,uVar30));
  auVar25._0_8_ = uVar32 + uVar30;
  l[5] = uVar38 + uVar28;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar3;
  *(undefined1 (*) [16])(l + 6) = auVar13 * auVar23 + auVar25;
  return;
}

Assistant:

static void secp256k1_scalar_sqr_512(uint64_t l[8], const secp256k1_scalar *a) {
#ifdef USE_ASM_X86_64
    __asm__ __volatile__(
    /* Preload */
    "movq 0(%%rdi), %%r11\n"
    "movq 8(%%rdi), %%r12\n"
    "movq 16(%%rdi), %%r13\n"
    "movq 24(%%rdi), %%r14\n"
    /* (rax,rdx) = a0 * a0 */
    "movq %%r11, %%rax\n"
    "mulq %%r11\n"
    /* Extract l0 */
    "movq %%rax, 0(%%rsi)\n"
    /* (r8,r9,r10) = (rdx,0) */
    "movq %%rdx, %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += 2 * a0 * a1 */
    "movq %%r11, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* Extract l1 */
    "movq %%r8, 8(%%rsi)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += 2 * a0 * a2 */
    "movq %%r11, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += a1 * a1 */
    "movq %%r12, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* Extract l2 */
    "movq %%r9, 16(%%rsi)\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += 2 * a0 * a3 */
    "movq %%r11, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += 2 * a1 * a2 */
    "movq %%r12, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* Extract l3 */
    "movq %%r10, 24(%%rsi)\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += 2 * a1 * a3 */
    "movq %%r12, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += a2 * a2 */
    "movq %%r13, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* Extract l4 */
    "movq %%r8, 32(%%rsi)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += 2 * a2 * a3 */
    "movq %%r13, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* Extract l5 */
    "movq %%r9, 40(%%rsi)\n"
    /* (r10,r8) += a3 * a3 */
    "movq %%r14, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    /* Extract l6 */
    "movq %%r10, 48(%%rsi)\n"
    /* Extract l7 */
    "movq %%r8, 56(%%rsi)\n"
    :
    : "S"(l), "D"(a->d)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "r14", "cc", "memory");
#else
    /* 160 bit accumulator. */
    uint64_t c0 = 0, c1 = 0;
    uint32_t c2 = 0;

    /* l[0..7] = a[0..3] * b[0..3]. */
    muladd_fast(a->d[0], a->d[0]);
    extract_fast(l[0]);
    muladd2(a->d[0], a->d[1]);
    extract(l[1]);
    muladd2(a->d[0], a->d[2]);
    muladd(a->d[1], a->d[1]);
    extract(l[2]);
    muladd2(a->d[0], a->d[3]);
    muladd2(a->d[1], a->d[2]);
    extract(l[3]);
    muladd2(a->d[1], a->d[3]);
    muladd(a->d[2], a->d[2]);
    extract(l[4]);
    muladd2(a->d[2], a->d[3]);
    extract(l[5]);
    muladd_fast(a->d[3], a->d[3]);
    extract_fast(l[6]);
    VERIFY_CHECK(c1 == 0);
    l[7] = c0;
#endif
}